

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int __thiscall
CVmObjDate::getp_getJulianDate(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint *puVar1;
  int iVar2;
  CVmTimeZone *this_00;
  uint argc;
  uint uVar3;
  int iVar4;
  int iVar5;
  int m;
  int y;
  int d;
  caldate_t cd;
  uint local_48;
  uint local_44;
  uint local_40;
  caldate_t local_3c;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_getJulianDate(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getJulianDate();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getJulianDate::desc);
  if (iVar2 == 0) {
    this_00 = get_tz_arg(0,argc);
    puVar1 = (uint *)(this->super_CVmObject).ext_;
    local_44 = *puVar1;
    local_48 = puVar1[1];
    CVmTimeZone::utc_to_local(this_00,(int32_t *)&local_44,(int32_t *)&local_48,&local_3c.y);
    caldate_t::set_dayno(&local_3c,local_44);
    caldate_t::julian_date(&local_3c,(int *)&local_44,(int *)&local_48,(int *)&local_40);
    uVar3 = (uint)((long)local_3c.m < 3);
    iVar4 = local_3c.y - uVar3;
    iVar2 = (local_3c.y - uVar3) + 3;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
    iVar5 = (int)((ulong)((long)iVar4 * -0x51eb851f) >> 0x20);
    make_int_list(retval,4,(ulong)local_44,(ulong)local_48,(ulong)local_40,
                  (ulong)((iVar4 + local_3c.d +
                                   *(int *)("12julcaldate_t" + (long)local_3c.m * 4 + 0xd) +
                           (iVar2 >> 2) + ((iVar5 >> 5) - (iVar5 >> 0x1f)) + iVar4 / 400) % 7 + 1));
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getJulianDate(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date in local time */
    int32_t dayno = get_local_date(get_tz_arg(vmg_ 0, argc));

    /* get the julian date */
    caldate_t cd(dayno);
    int y, m, d;
    cd.julian_date(y, m, d);

    /* 
     *   Return [year, month, monthday, weekday].  Note that there's no
     *   separate Julian weekday calculation, since the Julian calendar and
     *   Gregorian agree on the day of the week for every day.
     */
    make_int_list(vmg_ retval, 4, y, m, d, cd.weekday() + 1);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}